

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfft_host.c
# Opt level: O3

int dfft_execute(cpx_t *h_in,cpx_t *h_out,int dir,dfft_plan p)

{
  int *dim;
  int *inembed;
  int *embed;
  int *pdim;
  int *pidx;
  MPI_Comm comm;
  int *dfft_offset_recv;
  int *dfft_offset_send;
  int *dfft_nrecv;
  int *dfft_nsend;
  int size_in;
  int iVar1;
  int row_m;
  int *proc_map;
  plan_t **pppVar2;
  plan_t **pppVar3;
  int iVar4;
  cpx_t *work;
  bool bVar5;
  cpx_t *local_b0;
  
  work = p.scratch;
  iVar4 = 2;
  if (p.device == 0) {
    if (h_in == h_out) {
      local_b0 = p.scratch;
      work = h_in;
    }
    else {
      local_b0 = p.scratch_2;
      memcpy(p.scratch,h_in,(long)p.size_in << 3);
    }
    proc_map = p.proc_map;
    row_m = p.row_m;
    iVar1 = p.input_cyclic;
    size_in = p.size_in;
    dfft_nsend = p.nsend;
    dfft_nrecv = p.nrecv;
    dfft_offset_send = p.offset_send;
    dfft_offset_recv = p.offset_recv;
    comm = p.comm;
    pidx = p.pidx;
    pdim = p.pdim;
    inembed = p.inembed;
    dim = p.gdim;
    iVar4 = p.ndim;
    if ((dir == 0 && p.input_cyclic == 0) || ((dir != 0 && (p.output_cyclic == 0)))) {
      redistribute_nd(p.gdim,p.pdim,p.ndim,p.pidx,p.size_in,p.inembed,work,local_b0,p.nsend,p.nrecv,
                      p.offset_send,p.offset_recv,0,p.comm,p.proc_map,p.row_m);
    }
    embed = p.oembed;
    bVar5 = dir != 0;
    pppVar2 = &p.plans_short_forward;
    if (bVar5) {
      pppVar2 = &p.plans_short_inverse;
    }
    pppVar3 = &p.plans_long_forward;
    if (bVar5) {
      pppVar3 = &p.plans_long_inverse;
    }
    mpifftnd_dif(dim,pdim,iVar4,pidx,dir,size_in,inembed,p.oembed,work,local_b0,*pppVar2,*pppVar3,
                 p.rho_L,p.rho_pk0,p.rho_Lk0,dfft_nsend,dfft_nrecv,dfft_offset_send,dfft_offset_recv
                 ,comm,proc_map,row_m);
    if ((bVar5 && iVar1 == 0) || (dir == 0 && p.output_cyclic == 0)) {
      redistribute_nd(dim,pdim,iVar4,pidx,p.size_out,embed,work,local_b0,dfft_nsend,dfft_nrecv,
                      dfft_offset_send,dfft_offset_recv,1,comm,proc_map,row_m);
    }
    iVar4 = 0;
    if (h_in != h_out) {
      memcpy(h_out,work,(long)p.size_out << 3);
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int dfft_execute(cpx_t *h_in, cpx_t *h_out, int dir, dfft_plan p)
    {
    /* only works on host plans */
    if (p.device) return 2;

    int out_of_place = (h_in == h_out) ? 0 : 1;

    cpx_t *scratch, *work;

    if (out_of_place)
        {
        work = p.scratch;
        scratch = p.scratch_2;
        memcpy(work, h_in, p.size_in*sizeof(cpx_t));
        }
    else
        {
        scratch = p.scratch;
        /*! FIXME need to ensure in buf size >= scratch_size */
        work = h_in;
        }

    if ((!dir && !p.input_cyclic) || (dir && !p.output_cyclic))
        {
        /* redistribution of input */
        redistribute_nd(p.gdim, p.pdim, p.ndim, p.pidx,
            p.size_in, p.inembed, work, scratch, p.nsend,p.nrecv,
            p.offset_send,p.offset_recv, 0, p.comm, p.proc_map, p.row_m);
        }

    /* multi-dimensional FFT */
    mpifftnd_dif(p.gdim, p.pdim, p.ndim, p.pidx, dir,
        p.size_in,p.inembed,p.oembed, work, scratch,
        dir ? p.plans_short_inverse : p.plans_short_forward,
        dir ? p.plans_long_inverse : p.plans_long_forward,
        p.rho_L, p.rho_pk0, p.rho_Lk0, p.nsend,p.nrecv,
        p.offset_send,p.offset_recv, p.comm, p.proc_map, p.row_m);

    if ((dir && !p.input_cyclic) || (!dir && !p.output_cyclic))
        {
        /* redistribution of output */
        redistribute_nd(p.gdim, p.pdim, p.ndim, p.pidx,
            p.size_out,p.oembed, work, scratch, p.nsend,p.nrecv,
            p.offset_send,p.offset_recv, 1, p.comm, p.proc_map, p.row_m);
        }

    if (out_of_place)
        {
        memcpy(h_out, work, sizeof(cpx_t)*p.size_out);
        }

    return 0;
    }